

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

int Dau_DecVerify(word *pInit,int nVars,char *pDsdC,char *pDsdD)

{
  byte bVar1;
  word *pwVar2;
  ulong uVar3;
  word *pwVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  word pC1;
  word pC0;
  word pC [8192];
  word pRes [8192];
  word pD [8192];
  
  pwVar4 = &pC1;
  bVar1 = (byte)nVars;
  uVar5 = 1 << (bVar1 - 5 & 0x1f);
  uVar7 = 1 << (bVar1 - 6 & 0x1f);
  if (nVars < 7) {
    uVar7 = 1;
  }
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x2b4,"int Dau_DecVerify(word *, int, char *, char *)");
  }
  uVar6 = uVar5;
  if (nVars < 6) {
    uVar6 = 1;
  }
  pwVar2 = Dau_DsdToTruth(pDsdC,nVars + 1);
  memcpy(pC,pwVar2,(long)(int)uVar6 << 3);
  pwVar2 = Dau_DsdToTruth(pDsdD,nVars);
  memcpy(pD,pwVar2,(long)(int)uVar7 * 8);
  if (nVars < 6) {
    pC0 = Abc_Tt6Stretch(pC[0],nVars);
    pwVar2 = &pC0;
    uVar5 = 1;
    pC1 = Abc_Tt6Stretch(pC[0] >> ((byte)(1 << (bVar1 & 0x1f)) & 0x3f),nVars);
  }
  else {
    if ((int)uVar7 < 1) {
      __assert_fail("nWordsD >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                    ,0x2b9,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    if ((int)uVar5 < 2) {
      __assert_fail("nWordsC > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                    ,0x2ba,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    pwVar4 = pC + (int)uVar7;
    pwVar2 = pC;
    uVar5 = uVar7;
  }
  Abc_TtMux(pRes,pD,pwVar4,pwVar2,uVar5);
  uVar3 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar3;
  }
  do {
    if (uVar8 == uVar3) goto LAB_0043cf09;
    pwVar4 = pInit + uVar3;
    pwVar2 = pRes + uVar3;
    uVar3 = uVar3 + 1;
  } while (*pwVar4 == *pwVar2);
  printf("      Verification failed");
LAB_0043cf09:
  putchar(10);
  return 1;
}

Assistant:

int Dau_DecVerify( word * pInit, int nVars, char * pDsdC, char * pDsdD )
{
    word pC[1<<13], pD[1<<13], pRes[1<<13]; // max = 16
    int nWordsC = Abc_TtWordNum(nVars+1);
    int nWordsD = Abc_TtWordNum(nVars);
    assert( nVars < 16 );
    memcpy( pC, Dau_DsdToTruth(pDsdC, nVars+1), sizeof(word) * nWordsC );
    memcpy( pD, Dau_DsdToTruth(pDsdD, nVars), sizeof(word) * nWordsD );
    if ( nVars >= 6 )
    {
        assert( nWordsD >= 1 );
        assert( nWordsC > 1 );
        Abc_TtMux( pRes, pD, pC + nWordsD, pC, nWordsD );
    }
    else
    {
        word pC0 = Abc_Tt6Stretch( pC[0], nVars );
        word pC1 = Abc_Tt6Stretch( (pC[0] >> (1 << nVars)), nVars );
        Abc_TtMux( pRes, pD, &pC1, &pC0, nWordsD );
    }
    if ( !Abc_TtEqual(pInit, pRes, nWordsD) )
        printf( "      Verification failed" );
//    else
//        printf( "      Verification successful" );
    printf( "\n" );
    return 1;
}